

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

bool __thiscall
spirv_cross::CompilerGLSL::is_stage_output_variable_masked(CompilerGLSL *this,SPIRVariable *var)

{
  bool bVar1;
  uint32_t uVar2;
  BuiltIn builtin;
  uint32_t component;
  SPIRType *pSVar3;
  bool is_builtin;
  bool is_block;
  SPIRType *type;
  SPIRVariable *var_local;
  CompilerGLSL *this_local;
  
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).field_0xc);
  pSVar3 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,uVar2);
  bVar1 = Compiler::has_decoration(&this->super_Compiler,(ID)(pSVar3->super_IVariant).self.id,Block)
  ;
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    bVar1 = Compiler::has_decoration
                      (&this->super_Compiler,(ID)(var->super_IVariant).self.id,BuiltIn);
    if (bVar1) {
      builtin = Compiler::get_decoration
                          (&this->super_Compiler,(ID)(var->super_IVariant).self.id,BuiltIn);
      this_local._7_1_ = is_stage_output_builtin_masked(this,builtin);
    }
    else {
      bVar1 = Compiler::has_decoration
                        (&this->super_Compiler,(ID)(var->super_IVariant).self.id,DecorationLocation)
      ;
      if (bVar1) {
        uVar2 = Compiler::get_decoration
                          (&this->super_Compiler,(ID)(var->super_IVariant).self.id,
                           DecorationLocation);
        component = Compiler::get_decoration
                              (&this->super_Compiler,(ID)(var->super_IVariant).self.id,Component);
        this_local._7_1_ = is_stage_output_location_masked(this,uVar2,component);
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool CompilerGLSL::is_stage_output_variable_masked(const SPIRVariable &var) const
{
	auto &type = get<SPIRType>(var.basetype);
	bool is_block = has_decoration(type.self, DecorationBlock);
	// Blocks by themselves are never masked. Must be masked per-member.
	if (is_block)
		return false;

	bool is_builtin = has_decoration(var.self, DecorationBuiltIn);

	if (is_builtin)
	{
		return is_stage_output_builtin_masked(BuiltIn(get_decoration(var.self, DecorationBuiltIn)));
	}
	else
	{
		if (!has_decoration(var.self, DecorationLocation))
			return false;

		return is_stage_output_location_masked(
				get_decoration(var.self, DecorationLocation),
				get_decoration(var.self, DecorationComponent));
	}
}